

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall CLPIParser::parseSequenceInfo(CLPIParser *this,uint8_t *buffer,uint8_t *end)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  byte local_45;
  byte local_42;
  undefined1 local_40 [3];
  uint8_t stc_id;
  uchar offset_STC_id;
  uchar number_of_STC_sequences;
  uint8_t atc_id;
  uchar number_of_ATC_sequences;
  BitStreamReader reader;
  uint8_t *end_local;
  uint8_t *buffer_local;
  CLPIParser *this_local;
  
  reader._24_8_ = end;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_40);
  BitStreamReader::setBuffer((BitStreamReader *)local_40,buffer,(uint8_t *)reader._24_8_);
  BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
  BitStreamReader::skipBits((BitStreamReader *)local_40,8);
  bVar1 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,8);
  for (local_42 = 0; local_42 < bVar1; local_42 = local_42 + 1) {
    BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
    bVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,8);
    bVar3 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,8);
    for (local_45 = bVar3; (uint)local_45 < (uint)bVar2 + (uint)bVar3; local_45 = local_45 + 1) {
      BitStreamReader::skipBits((BitStreamReader *)local_40,0x10);
      BitStreamReader::skipBits((BitStreamReader *)local_40,0x20);
      uVar4 = BitStreamReader::getBits((BitStreamReader *)local_40,0x20);
      this->presentation_start_time = uVar4;
      uVar4 = BitStreamReader::getBits((BitStreamReader *)local_40,0x20);
      this->presentation_end_time = uVar4;
    }
  }
  return;
}

Assistant:

void CLPIParser::parseSequenceInfo(uint8_t* buffer, const uint8_t* end)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    reader.skipBits(32);                                              // length
    reader.skipBits(8);                                               // reserved_for_word_align
    const auto number_of_ATC_sequences = reader.getBits<uint8_t>(8);  // 1 is tipical value
    for (uint8_t atc_id = 0; atc_id < number_of_ATC_sequences; atc_id++)
    {
        reader.skipBits(32);  // SPN_ATC_start, 0 is tipical value
        const auto number_of_STC_sequences = reader.getBits<uint8_t>(8);
        const auto offset_STC_id = reader.getBits<uint8_t>(8);
        for (uint8_t stc_id = offset_STC_id; stc_id < number_of_STC_sequences + offset_STC_id; stc_id++)
        {
            reader.skipBits(16);  // PCR_PID
            reader.skipBits(32);  // SPN_STC_start
            presentation_start_time = reader.getBits(32);
            presentation_end_time = reader.getBits(32);
        }
    }
}